

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O3

void __thiscall
ruckig::PositionThirdOrderStep1::time_acc0_acc1
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax,bool return_after_found)

{
  double dVar1;
  Profile *pPVar2;
  ProfileIter pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined4 in_EAX;
  undefined4 extraout_EAX;
  int iVar7;
  long lVar8;
  BrakeProfile *pBVar9;
  BrakeProfile *pBVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  
  bVar11 = 0;
  dVar25 = aMax - aMin;
  auVar16._0_8_ =
       (this->af_p4 * aMax - this->a0_p4 * aMin) * 3.0 +
       (aMax * -6.0 * this->a0_a0 +
       aMin * 6.0 * this->af_af + (this->a0_p3 - this->af_p3) * 8.0 + aMax * 3.0 * aMin * dVar25) *
       aMax * aMin +
       ((((aMax - (this->a0 + this->a0)) * this->v0 - (aMin - (this->af + this->af)) * this->vf) *
         aMax * aMin + this->a0_a0 * aMin * this->v0) - this->af_af * aMax * this->vf) * jMax * 12.0
  ;
  auVar16._8_8_ =
       ((this->vf_vf * aMax - this->v0_v0 * aMin) - (aMin + aMin) * aMax * this->pd) * 4.0;
  auVar14._0_8_ = dVar25 * 3.0 * this->jMax_jMax;
  auVar14._8_8_ = dVar25;
  auVar14 = divpd(auVar16,auVar14);
  dVar25 = auVar14._8_8_ + auVar14._0_8_;
  if (dVar25 < 0.0) {
    return;
  }
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
    in_EAX = extraout_EAX;
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  dVar25 = dVar25 * 0.5;
  auVar22._8_8_ = aMax;
  auVar22._0_8_ = aMin;
  auVar15._0_8_ = -this->af_af;
  dVar20 = -dVar25;
  auVar21._8_8_ = dVar25;
  auVar21._0_8_ = dVar20;
  auVar22 = divpd(auVar21,auVar22);
  auVar18._0_8_ = aMin - (aMax + aMax);
  auVar18._8_8_ = aMax - (aMin + aMin);
  auVar12._8_8_ = this->v0;
  auVar12._0_8_ = this->a0_a0;
  auVar19._8_8_ = aMax;
  auVar19._0_8_ = (aMax + aMax) * jMax;
  auVar14 = divpd(auVar12,auVar19);
  auVar15._8_8_ = this->vf;
  auVar5._8_8_ = aMin;
  auVar5._0_8_ = (aMin + aMin) * jMax;
  auVar16 = divpd(auVar15,auVar5);
  auVar4._8_8_ = jMax + jMax;
  auVar4._0_8_ = jMax + jMax;
  auVar19 = divpd(auVar18,auVar4);
  dVar17 = (auVar16._0_8_ - auVar19._8_8_) + auVar16._8_8_;
  dVar24 = (auVar19._0_8_ + auVar14._0_8_) - auVar14._8_8_;
  dVar23 = auVar22._8_8_;
  auVar13._8_8_ = -(ulong)(dVar23 < dVar24);
  auVar13._0_8_ = -(ulong)(auVar22._0_8_ < dVar17);
  iVar7 = movmskpd(in_EAX,auVar13);
  if (iVar7 == 3) {
    pPVar2 = *profile;
    (pPVar2->t)._M_elems[0] = (aMax - this->a0) / jMax;
    (pPVar2->t)._M_elems[1] = dVar24 - dVar23;
    (pPVar2->t)._M_elems[2] = aMax / jMax;
    (pPVar2->t)._M_elems[3] = 0.0;
    (pPVar2->t)._M_elems[4] = -aMin / jMax;
    (pPVar2->t)._M_elems[5] = dVar25 / aMin + dVar17;
    (pPVar2->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
    bVar6 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                      (pPVar2,jMax,vMax,vMin,aMax,aMin);
    if (bVar6) {
      pvVar3 = *profile;
      *profile = pvVar3 + 1;
      dVar1 = (pvVar3->v)._M_elems[0];
      pvVar3[1].a._M_elems[0] = (pvVar3->a)._M_elems[0];
      pvVar3[1].v._M_elems[0] = dVar1;
      pvVar3[1].p._M_elems[0] = (pvVar3->p)._M_elems[0];
      pvVar3[1].af = pvVar3->af;
      dVar1 = pvVar3->vf;
      pvVar3[1].pf = pvVar3->pf;
      pvVar3[1].vf = dVar1;
      pBVar9 = &pvVar3->brake;
      pBVar10 = &pvVar3[1].brake;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        pBVar10->duration = pBVar9->duration;
        pBVar9 = (BrakeProfile *)((long)pBVar9 + (ulong)bVar11 * -0x10 + 8);
        pBVar10 = (BrakeProfile *)((long)pBVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      pBVar9 = &pvVar3->accel;
      pBVar10 = &pvVar3[1].accel;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        pBVar10->duration = pBVar9->duration;
        pBVar9 = (BrakeProfile *)((long)pBVar9 + (ulong)bVar11 * -0x10 + 8);
        pBVar10 = (BrakeProfile *)((long)pBVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      if (dVar24 <= dVar20 / aMax || return_after_found) {
        return;
      }
      goto LAB_0013e684;
    }
  }
  if (dVar24 <= dVar20 / aMax) {
    return;
  }
LAB_0013e684:
  if (dVar25 / aMin < dVar17) {
    pPVar2 = *profile;
    (pPVar2->t)._M_elems[0] = (aMax - this->a0) / jMax;
    (pPVar2->t)._M_elems[1] = dVar23 + dVar24;
    (pPVar2->t)._M_elems[2] = aMax / jMax;
    (pPVar2->t)._M_elems[3] = 0.0;
    (pPVar2->t)._M_elems[4] = -aMin / jMax;
    (pPVar2->t)._M_elems[5] = dVar17 - dVar25 / aMin;
    (pPVar2->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
    bVar6 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                      (pPVar2,jMax,vMax,vMin,aMax,aMin);
    if (bVar6) {
      pvVar3 = *profile;
      *profile = pvVar3 + 1;
      dVar25 = (pvVar3->v)._M_elems[0];
      pvVar3[1].a._M_elems[0] = (pvVar3->a)._M_elems[0];
      pvVar3[1].v._M_elems[0] = dVar25;
      pvVar3[1].p._M_elems[0] = (pvVar3->p)._M_elems[0];
      pvVar3[1].af = pvVar3->af;
      dVar25 = pvVar3->vf;
      pvVar3[1].pf = pvVar3->pf;
      pvVar3[1].vf = dVar25;
      pBVar9 = &pvVar3->brake;
      pBVar10 = &pvVar3[1].brake;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        pBVar10->duration = pBVar9->duration;
        pBVar9 = (BrakeProfile *)((long)pBVar9 + (ulong)bVar11 * -0x10 + 8);
        pBVar10 = (BrakeProfile *)((long)pBVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      pBVar9 = &pvVar3->accel;
      pBVar10 = &pvVar3[1].accel;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        pBVar10->duration = pBVar9->duration;
        pBVar9 = (BrakeProfile *)((long)pBVar9 + (ulong)bVar11 * -0x10 + 8);
        pBVar10 = (BrakeProfile *)((long)pBVar10 + (ulong)bVar11 * -0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_acc0_acc1(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax, bool return_after_found) const {
    double h1 = (3*(af_p4*aMax - a0_p4*aMin) + aMax*aMin*(8*(a0_p3 - af_p3) + 3*aMax*aMin*(aMax - aMin) + 6*aMin*af_af - 6*aMax*a0_a0) + 12*jMax*(aMax*aMin*((aMax - 2*a0)*v0 - (aMin - 2*af)*vf) + aMin*a0_a0*v0 - aMax*af_af*vf))/(3*(aMax - aMin)*jMax_jMax) + 4*(aMax*vf_vf - aMin*v0_v0 - 2*aMin*aMax*pd)/(aMax - aMin);

    if (h1 >= 0) {
        h1 = std::sqrt(h1) / 2;
        const double h2 = a0_a0/(2*aMax*jMax) + (aMin - 2*aMax)/(2*jMax) - v0/aMax;
        const double h3 = -af_af/(2*aMin*jMax) - (aMax - 2*aMin)/(2*jMax) + vf/aMin;

        // UDDU: Solution 2
        if (h2 > h1/aMax && h3 > -h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 - h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 + h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
                if (return_after_found) {
                    return;
                }
            }
        }

        // UDDU: Solution 1
        if (h2 > -h1/aMax && h3 > h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 + h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 - h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
            }
        }
    }
}